

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::AssertionStats::~AssertionStats(AssertionStats *this)

{
  pointer pcVar1;
  
  this->_vptr_AssertionStats = (_func_int **)&PTR__AssertionStats_005cb030;
  clara::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&(this->totals).skippedTestReasons._M_t);
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector
            (&this->infoMessages);
  pcVar1 = (this->assertionResult).m_resultData.reconstructedExpression._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->assertionResult).m_resultData.reconstructedExpression.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->assertionResult).m_resultData.message._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->assertionResult).m_resultData.message.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

AssertionStats::~AssertionStats() = default;